

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_elements_transaction.cpp
# Opt level: O0

IssuanceParameter * __thiscall
cfd::core::ConfidentialTransaction::SetAssetIssuance
          (IssuanceParameter *__return_storage_ptr__,ConfidentialTransaction *this,
          uint32_t tx_in_index,Amount *asset_amount,
          vector<cfd::core::Amount,_std::allocator<cfd::core::Amount>_> *asset_output_amount_list,
          vector<cfd::core::Script,_std::allocator<cfd::core::Script>_> *asset_locking_script_list,
          vector<cfd::core::ConfidentialNonce,_std::allocator<cfd::core::ConfidentialNonce>_>
          *asset_nonce_list,Amount *token_amount,
          vector<cfd::core::Amount,_std::allocator<cfd::core::Amount>_> *token_output_amount_list,
          vector<cfd::core::Script,_std::allocator<cfd::core::Script>_> *token_locking_script_list,
          vector<cfd::core::ConfidentialNonce,_std::allocator<cfd::core::ConfidentialNonce>_>
          *token_nonce_list,bool is_blind,ByteData256 *contract_hash)

{
  byte bVar1;
  vector<cfd::core::Script,_std::allocator<cfd::core::Script>_> *pvVar2;
  bool bVar3;
  uint32_t uVar4;
  reference pvVar5;
  size_t sVar6;
  int64_t iVar7;
  undefined8 uVar8;
  size_type sVar9;
  const_reference pvVar10;
  const_reference pvVar11;
  const_reference pvVar12;
  bool bVar13;
  Amount AVar14;
  ByteData256 *in_stack_fffffffffffff988;
  ByteData256 *in_stack_fffffffffffff990;
  string *in_stack_fffffffffffff9a0;
  undefined8 in_stack_fffffffffffff9a8;
  CfdError CVar15;
  ConfidentialAssetId *asset;
  CfdException *in_stack_fffffffffffff9b0;
  ulong uVar16;
  undefined1 local_4e0 [8];
  ConfidentialNonce nonce_1;
  size_t index_1;
  ConfidentialNonce nonce;
  size_t index;
  ByteData local_468;
  ConfidentialValue local_450;
  ConfidentialValue local_428;
  ByteData256 local_400;
  ByteData256 local_3e8;
  ByteData256 local_3d0;
  Txid local_3b8;
  undefined1 local_393;
  undefined1 local_392;
  allocator local_391;
  string local_390 [32];
  CfdSourceLocation local_370;
  reference local_358;
  Script *script_1;
  const_iterator __end3_3;
  const_iterator __begin3_3;
  vector<cfd::core::Script,_std::allocator<cfd::core::Script>_> *__range3_3;
  string local_330 [32];
  CfdSourceLocation local_310;
  int64_t local_2f8;
  undefined1 local_2f0;
  reference local_2e8;
  Amount *amount_1;
  const_iterator __end3_2;
  const_iterator __begin3_2;
  vector<cfd::core::Amount,_std::allocator<cfd::core::Amount>_> *__range3_2;
  Amount total_1;
  string local_2b0 [32];
  CfdSourceLocation local_290;
  undefined1 local_272;
  allocator local_271;
  string local_270 [32];
  CfdSourceLocation local_250;
  reference local_238;
  Script *script;
  const_iterator __end3_1;
  const_iterator __begin3_1;
  vector<cfd::core::Script,_std::allocator<cfd::core::Script>_> *__range3_1;
  string local_210 [32];
  CfdSourceLocation local_1f0;
  int64_t local_1d8;
  undefined1 local_1d0;
  reference local_1c8;
  Amount *amount;
  const_iterator __end3;
  const_iterator __begin3;
  vector<cfd::core::Amount,_std::allocator<cfd::core::Amount>_> *__range3;
  Amount total;
  string local_190 [32];
  CfdSourceLocation local_170;
  undefined1 local_152;
  allocator local_151;
  string local_150 [32];
  CfdSourceLocation local_130;
  undefined1 local_112;
  allocator local_111;
  string local_110 [32];
  CfdSourceLocation local_f0;
  byte local_d2;
  byte local_d1;
  ConfidentialValue local_d0;
  ByteData local_a8;
  ConfidentialValue local_80;
  ByteData local_58;
  byte local_39;
  vector<cfd::core::Script,_std::allocator<cfd::core::Script>_> *pvStack_38;
  bool is_blind_local;
  vector<cfd::core::Script,_std::allocator<cfd::core::Script>_> *asset_locking_script_list_local;
  vector<cfd::core::Amount,_std::allocator<cfd::core::Amount>_> *asset_output_amount_list_local;
  Amount *asset_amount_local;
  ConfidentialTransaction *pCStack_18;
  uint32_t tx_in_index_local;
  ConfidentialTransaction *this_local;
  IssuanceParameter *param;
  
  local_39 = is_blind;
  pvStack_38 = asset_locking_script_list;
  asset_locking_script_list_local =
       (vector<cfd::core::Script,_std::allocator<cfd::core::Script>_> *)asset_output_amount_list;
  asset_output_amount_list_local =
       (vector<cfd::core::Amount,_std::allocator<cfd::core::Amount>_> *)asset_amount;
  asset_amount_local._4_4_ = tx_in_index;
  pCStack_18 = this;
  this_local = (ConfidentialTransaction *)__return_storage_ptr__;
  (*(this->super_AbstractTransaction)._vptr_AbstractTransaction[0xb])
            (this,(ulong)tx_in_index,0x750,"SetAssetIssuance");
  pvVar5 = ::std::vector<cfd::core::ConfidentialTxIn,_std::allocator<cfd::core::ConfidentialTxIn>_>
           ::operator[](&this->vin_,(ulong)asset_amount_local._4_4_);
  ConfidentialTxIn::GetInflationKeys(&local_80,pvVar5);
  local_d1 = 0;
  local_d2 = 0;
  ConfidentialValue::GetData(&local_58,&local_80);
  sVar6 = ByteData::GetDataSize(&local_58);
  bVar13 = true;
  if (sVar6 == 0) {
    pvVar5 = ::std::
             vector<cfd::core::ConfidentialTxIn,_std::allocator<cfd::core::ConfidentialTxIn>_>::
             operator[](&this->vin_,(ulong)asset_amount_local._4_4_);
    ConfidentialTxIn::GetIssuanceAmount(&local_d0,pvVar5);
    local_d1 = 1;
    ConfidentialValue::GetData(&local_a8,&local_d0);
    local_d2 = 1;
    sVar6 = ByteData::GetDataSize(&local_a8);
    bVar13 = sVar6 != 0;
  }
  if ((local_d2 & 1) != 0) {
    ByteData::~ByteData((ByteData *)0x4ac2aa);
  }
  if ((local_d1 & 1) != 0) {
    ConfidentialValue::~ConfidentialValue((ConfidentialValue *)0x4ac2c1);
  }
  ByteData::~ByteData((ByteData *)0x4ac2ca);
  ConfidentialValue::~ConfidentialValue((ConfidentialValue *)0x4ac2d3);
  CVar15 = (CfdError)((ulong)in_stack_fffffffffffff9a8 >> 0x20);
  if (bVar13) {
    local_f0.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/src/cfdcore_elements_transaction.cpp"
                 ,0x2f);
    local_f0.filename = local_f0.filename + 1;
    local_f0.line = 0x754;
    local_f0.funcname = "SetAssetIssuance";
    logger::warn<>(&local_f0,"already set to issue parameter");
    local_112 = 1;
    uVar8 = __cxa_allocate_exception(0x30);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string(local_110,"already set to issue parameter",&local_111);
    CfdException::CfdException(in_stack_fffffffffffff9b0,CVar15,in_stack_fffffffffffff9a0);
    local_112 = 0;
    __cxa_throw(uVar8,&CfdException::typeinfo,CfdException::~CfdException);
  }
  iVar7 = Amount::GetSatoshiValue((Amount *)asset_output_amount_list_local);
  if (iVar7 < 1) {
    iVar7 = Amount::GetSatoshiValue(token_amount);
    CVar15 = (CfdError)((ulong)in_stack_fffffffffffff9a8 >> 0x20);
    if (iVar7 < 1) {
      local_130.filename =
           strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/src/cfdcore_elements_transaction.cpp"
                   ,0x2f);
      local_130.filename = local_130.filename + 1;
      local_130.line = 0x75a;
      local_130.funcname = "SetAssetIssuance";
      logger::warn<>(&local_130,"Issuance must have one non-zero amount.");
      local_152 = 1;
      uVar8 = __cxa_allocate_exception(0x30);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_150,"Issuance must have one non-zero amount.",&local_151)
      ;
      CfdException::CfdException(in_stack_fffffffffffff9b0,CVar15,in_stack_fffffffffffff9a0);
      local_152 = 0;
      __cxa_throw(uVar8,&CfdException::typeinfo,CfdException::~CfdException);
    }
  }
  bVar13 = ::std::vector<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>::empty
                     ((vector<cfd::core::Amount,_std::allocator<cfd::core::Amount>_> *)
                      asset_locking_script_list_local);
  bVar3 = ::std::vector<cfd::core::Script,_std::allocator<cfd::core::Script>_>::empty(pvStack_38);
  CVar15 = (CfdError)((ulong)in_stack_fffffffffffff9a8 >> 0x20);
  if (bVar13 != bVar3) {
    local_170.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/src/cfdcore_elements_transaction.cpp"
                 ,0x2f);
    local_170.filename = local_170.filename + 1;
    local_170.line = 0x760;
    local_170.funcname = "SetAssetIssuance";
    logger::warn<>(&local_170,"Unmatch count. asset amount list and locking script list.");
    total._14_1_ = 1;
    uVar8 = __cxa_allocate_exception(0x30);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              (local_190,"Unmatch count. asset amount list and locking script list.",
               (allocator *)&total.field_0xf);
    CfdException::CfdException(in_stack_fffffffffffff9b0,CVar15,in_stack_fffffffffffff9a0);
    total._14_1_ = 0;
    __cxa_throw(uVar8,&CfdException::typeinfo,CfdException::~CfdException);
  }
  bVar13 = ::std::vector<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>::empty
                     ((vector<cfd::core::Amount,_std::allocator<cfd::core::Amount>_> *)
                      asset_locking_script_list_local);
  if (!bVar13) {
    Amount::Amount((Amount *)&__range3);
    pvVar2 = asset_locking_script_list_local;
    __end3 = ::std::vector<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>::begin
                       ((vector<cfd::core::Amount,_std::allocator<cfd::core::Amount>_> *)
                        asset_locking_script_list_local);
    amount = (Amount *)
             ::std::vector<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>::end
                       ((vector<cfd::core::Amount,_std::allocator<cfd::core::Amount>_> *)pvVar2);
    while (bVar13 = __gnu_cxx::operator!=
                              (&__end3,(__normal_iterator<const_cfd::core::Amount_*,_std::vector<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>_>
                                        *)&amount), bVar13) {
      local_1c8 = __gnu_cxx::
                  __normal_iterator<const_cfd::core::Amount_*,_std::vector<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>_>
                  ::operator*(&__end3);
      AVar14 = Amount::operator+=((Amount *)&__range3,local_1c8);
      local_1d8 = AVar14.amount_;
      local_1d0 = AVar14.ignore_check_;
      __gnu_cxx::
      __normal_iterator<const_cfd::core::Amount_*,_std::vector<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>_>
      ::operator++(&__end3);
    }
    bVar13 = Amount::operator!=((Amount *)&__range3,(Amount *)asset_output_amount_list_local);
    pvVar2 = pvStack_38;
    CVar15 = (CfdError)((ulong)in_stack_fffffffffffff9a8 >> 0x20);
    if (bVar13) {
      local_1f0.filename =
           strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/src/cfdcore_elements_transaction.cpp"
                   ,0x2f);
      local_1f0.filename = local_1f0.filename + 1;
      local_1f0.line = 0x76c;
      local_1f0.funcname = "SetAssetIssuance";
      logger::warn<>(&local_1f0,"Unmatch asset amount.");
      __range3_1._6_1_ = 1;
      uVar8 = __cxa_allocate_exception(0x30);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                (local_210,"Unmatch asset amount.",(allocator *)((long)&__range3_1 + 7));
      CfdException::CfdException(in_stack_fffffffffffff9b0,CVar15,in_stack_fffffffffffff9a0);
      __range3_1._6_1_ = 0;
      __cxa_throw(uVar8,&CfdException::typeinfo,CfdException::~CfdException);
    }
    __end3_1 = ::std::vector<cfd::core::Script,_std::allocator<cfd::core::Script>_>::begin
                         (pvStack_38);
    script = (Script *)
             ::std::vector<cfd::core::Script,_std::allocator<cfd::core::Script>_>::end(pvVar2);
    while (bVar13 = __gnu_cxx::operator!=
                              (&__end3_1,
                               (__normal_iterator<const_cfd::core::Script_*,_std::vector<cfd::core::Script,_std::allocator<cfd::core::Script>_>_>
                                *)&script), bVar13) {
      local_238 = __gnu_cxx::
                  __normal_iterator<const_cfd::core::Script_*,_std::vector<cfd::core::Script,_std::allocator<cfd::core::Script>_>_>
                  ::operator*(&__end3_1);
      bVar13 = Script::IsEmpty(local_238);
      CVar15 = (CfdError)((ulong)in_stack_fffffffffffff9a8 >> 0x20);
      if (bVar13) {
        local_250.filename =
             strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/src/cfdcore_elements_transaction.cpp"
                     ,0x2f);
        local_250.filename = local_250.filename + 1;
        local_250.line = 0x771;
        local_250.funcname = "SetAssetIssuance";
        logger::warn<>(&local_250,"Empty locking script from asset.");
        local_272 = 1;
        uVar8 = __cxa_allocate_exception(0x30);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string(local_270,"Empty locking script from asset.",&local_271);
        CfdException::CfdException(in_stack_fffffffffffff9b0,CVar15,in_stack_fffffffffffff9a0);
        local_272 = 0;
        __cxa_throw(uVar8,&CfdException::typeinfo,CfdException::~CfdException);
      }
      __gnu_cxx::
      __normal_iterator<const_cfd::core::Script_*,_std::vector<cfd::core::Script,_std::allocator<cfd::core::Script>_>_>
      ::operator++(&__end3_1);
    }
  }
  bVar13 = ::std::vector<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>::empty
                     (token_output_amount_list);
  bVar3 = ::std::vector<cfd::core::Script,_std::allocator<cfd::core::Script>_>::empty
                    (token_locking_script_list);
  CVar15 = (CfdError)((ulong)in_stack_fffffffffffff9a8 >> 0x20);
  if (bVar13 != bVar3) {
    local_290.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/src/cfdcore_elements_transaction.cpp"
                 ,0x2f);
    local_290.filename = local_290.filename + 1;
    local_290.line = 0x779;
    local_290.funcname = "SetAssetIssuance";
    logger::warn<>(&local_290,"Unmatch count. token amount list and locking script list.");
    total_1._14_1_ = 1;
    uVar8 = __cxa_allocate_exception(0x30);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              (local_2b0,"Unmatch count. token amount list and locking script list.",
               (allocator *)&total_1.field_0xf);
    CfdException::CfdException(in_stack_fffffffffffff9b0,CVar15,in_stack_fffffffffffff9a0);
    total_1._14_1_ = 0;
    __cxa_throw(uVar8,&CfdException::typeinfo,CfdException::~CfdException);
  }
  bVar13 = ::std::vector<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>::empty
                     (token_output_amount_list);
  if (!bVar13) {
    Amount::Amount((Amount *)&__range3_2);
    __end3_2 = ::std::vector<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>::begin
                         (token_output_amount_list);
    amount_1 = (Amount *)
               ::std::vector<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>::end
                         (token_output_amount_list);
    while (bVar13 = __gnu_cxx::operator!=
                              (&__end3_2,
                               (__normal_iterator<const_cfd::core::Amount_*,_std::vector<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>_>
                                *)&amount_1), bVar13) {
      local_2e8 = __gnu_cxx::
                  __normal_iterator<const_cfd::core::Amount_*,_std::vector<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>_>
                  ::operator*(&__end3_2);
      AVar14 = Amount::operator+=((Amount *)&__range3_2,local_2e8);
      local_2f8 = AVar14.amount_;
      local_2f0 = AVar14.ignore_check_;
      __gnu_cxx::
      __normal_iterator<const_cfd::core::Amount_*,_std::vector<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>_>
      ::operator++(&__end3_2);
    }
    bVar13 = Amount::operator!=((Amount *)&__range3_2,token_amount);
    CVar15 = (CfdError)((ulong)in_stack_fffffffffffff9a8 >> 0x20);
    if (bVar13) {
      local_310.filename =
           strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/src/cfdcore_elements_transaction.cpp"
                   ,0x2f);
      local_310.filename = local_310.filename + 1;
      local_310.line = 0x785;
      local_310.funcname = "SetAssetIssuance";
      logger::warn<>(&local_310,"Unmatch token amount.");
      __range3_3._6_1_ = 1;
      uVar8 = __cxa_allocate_exception(0x30);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                (local_330,"Unmatch token amount.",(allocator *)((long)&__range3_3 + 7));
      CfdException::CfdException(in_stack_fffffffffffff9b0,CVar15,in_stack_fffffffffffff9a0);
      __range3_3._6_1_ = 0;
      __cxa_throw(uVar8,&CfdException::typeinfo,CfdException::~CfdException);
    }
    __end3_3 = ::std::vector<cfd::core::Script,_std::allocator<cfd::core::Script>_>::begin
                         (token_locking_script_list);
    script_1 = (Script *)
               ::std::vector<cfd::core::Script,_std::allocator<cfd::core::Script>_>::end
                         (token_locking_script_list);
    while (bVar13 = __gnu_cxx::operator!=
                              (&__end3_3,
                               (__normal_iterator<const_cfd::core::Script_*,_std::vector<cfd::core::Script,_std::allocator<cfd::core::Script>_>_>
                                *)&script_1), bVar13) {
      local_358 = __gnu_cxx::
                  __normal_iterator<const_cfd::core::Script_*,_std::vector<cfd::core::Script,_std::allocator<cfd::core::Script>_>_>
                  ::operator*(&__end3_3);
      bVar13 = Script::IsEmpty(local_358);
      CVar15 = (CfdError)((ulong)in_stack_fffffffffffff9a8 >> 0x20);
      if (bVar13) {
        local_370.filename =
             strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/src/cfdcore_elements_transaction.cpp"
                     ,0x2f);
        local_370.filename = local_370.filename + 1;
        local_370.line = 0x78a;
        local_370.funcname = "SetAssetIssuance";
        logger::warn<>(&local_370,"Empty locking script from token.");
        local_392 = 1;
        uVar8 = __cxa_allocate_exception(0x30);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string(local_390,"Empty locking script from token.",&local_391);
        CfdException::CfdException(in_stack_fffffffffffff9b0,CVar15,in_stack_fffffffffffff9a0);
        local_392 = 0;
        __cxa_throw(uVar8,&CfdException::typeinfo,CfdException::~CfdException);
      }
      __gnu_cxx::
      __normal_iterator<const_cfd::core::Script_*,_std::vector<cfd::core::Script,_std::allocator<cfd::core::Script>_>_>
      ::operator++(&__end3_3);
    }
  }
  local_393 = 0;
  pvVar5 = ::std::vector<cfd::core::ConfidentialTxIn,_std::allocator<cfd::core::ConfidentialTxIn>_>
           ::operator[](&this->vin_,(ulong)asset_amount_local._4_4_);
  AbstractTxIn::GetTxid(&local_3b8,&pvVar5->super_AbstractTxIn);
  pvVar5 = ::std::vector<cfd::core::ConfidentialTxIn,_std::allocator<cfd::core::ConfidentialTxIn>_>
           ::operator[](&this->vin_,(ulong)asset_amount_local._4_4_);
  uVar4 = AbstractTxIn::GetVout(&pvVar5->super_AbstractTxIn);
  bVar1 = local_39;
  ByteData256::ByteData256(&local_3d0);
  CalculateIssuanceValue
            (__return_storage_ptr__,&local_3b8,uVar4,(bool)(bVar1 & 1),contract_hash,&local_3d0);
  ByteData256::~ByteData256((ByteData256 *)0x4ad085);
  Txid::~Txid((Txid *)0x4ad091);
  uVar4 = asset_amount_local._4_4_;
  ByteData256::ByteData256(&local_3e8);
  ByteData256::ByteData256(in_stack_fffffffffffff990,in_stack_fffffffffffff988);
  ConfidentialValue::ConfidentialValue(&local_428,(Amount *)asset_output_amount_list_local);
  ConfidentialValue::ConfidentialValue(&local_450,token_amount);
  ByteData::ByteData(&local_468);
  ByteData::ByteData((ByteData *)&index);
  SetIssuance(this,uVar4,&local_3e8,&local_400,&local_428,&local_450,&local_468,(ByteData *)&index);
  ByteData::~ByteData((ByteData *)0x4ad14e);
  ByteData::~ByteData((ByteData *)0x4ad15a);
  ConfidentialValue::~ConfidentialValue((ConfidentialValue *)0x4ad166);
  ConfidentialValue::~ConfidentialValue((ConfidentialValue *)0x4ad172);
  ByteData256::~ByteData256((ByteData256 *)0x4ad17e);
  ByteData256::~ByteData256((ByteData256 *)0x4ad18a);
  bVar13 = ::std::vector<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>::empty
                     ((vector<cfd::core::Amount,_std::allocator<cfd::core::Amount>_> *)
                      asset_locking_script_list_local);
  if ((!bVar13) &&
     (iVar7 = Amount::GetSatoshiValue((Amount *)asset_output_amount_list_local), 0 < iVar7)) {
    nonce.version_ = '\0';
    nonce._33_7_ = 0;
    for (; uVar8 = nonce._32_8_,
        sVar9 = ::std::vector<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>::size
                          ((vector<cfd::core::Amount,_std::allocator<cfd::core::Amount>_> *)
                           asset_locking_script_list_local), (ulong)uVar8 < sVar9;
        nonce._32_8_ = nonce._32_8_ + 1) {
      ConfidentialNonce::ConfidentialNonce((ConfidentialNonce *)&index_1);
      uVar8 = nonce._32_8_;
      sVar9 = ::std::
              vector<cfd::core::ConfidentialNonce,_std::allocator<cfd::core::ConfidentialNonce>_>::
              size(asset_nonce_list);
      if ((ulong)uVar8 < sVar9) {
        pvVar10 = ::std::
                  vector<cfd::core::ConfidentialNonce,_std::allocator<cfd::core::ConfidentialNonce>_>
                  ::operator[](asset_nonce_list,nonce._32_8_);
        ConfidentialNonce::operator=((ConfidentialNonce *)&index_1,pvVar10);
      }
      pvVar11 = ::std::vector<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>::operator[]
                          ((vector<cfd::core::Amount,_std::allocator<cfd::core::Amount>_> *)
                           asset_locking_script_list_local,nonce._32_8_);
      pvVar12 = ::std::vector<cfd::core::Script,_std::allocator<cfd::core::Script>_>::operator[]
                          (pvStack_38,nonce._32_8_);
      AddTxOut(this,pvVar11,&__return_storage_ptr__->asset,pvVar12,(ConfidentialNonce *)&index_1);
      ConfidentialNonce::~ConfidentialNonce((ConfidentialNonce *)0x4ad3e4);
    }
  }
  bVar13 = ::std::vector<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>::empty
                     (token_output_amount_list);
  if ((!bVar13) && (iVar7 = Amount::GetSatoshiValue(token_amount), 0 < iVar7)) {
    nonce_1.version_ = '\0';
    nonce_1._33_7_ = 0;
    for (; uVar8 = nonce_1._32_8_,
        sVar9 = ::std::vector<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>::size
                          (token_output_amount_list), (ulong)uVar8 < sVar9;
        nonce_1._32_8_ = nonce_1._32_8_ + 1) {
      ConfidentialNonce::ConfidentialNonce((ConfidentialNonce *)local_4e0);
      uVar16 = nonce_1._32_8_;
      sVar9 = ::std::
              vector<cfd::core::ConfidentialNonce,_std::allocator<cfd::core::ConfidentialNonce>_>::
              size(token_nonce_list);
      if (uVar16 < sVar9) {
        pvVar10 = ::std::
                  vector<cfd::core::ConfidentialNonce,_std::allocator<cfd::core::ConfidentialNonce>_>
                  ::operator[](token_nonce_list,nonce_1._32_8_);
        ConfidentialNonce::operator=((ConfidentialNonce *)local_4e0,pvVar10);
      }
      pvVar11 = ::std::vector<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>::operator[]
                          (token_output_amount_list,nonce_1._32_8_);
      asset = &__return_storage_ptr__->token;
      pvVar12 = ::std::vector<cfd::core::Script,_std::allocator<cfd::core::Script>_>::operator[]
                          (token_locking_script_list,nonce_1._32_8_);
      AddTxOut(this,pvVar11,asset,pvVar12,(ConfidentialNonce *)local_4e0);
      ConfidentialNonce::~ConfidentialNonce((ConfidentialNonce *)0x4ad54b);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

IssuanceParameter ConfidentialTransaction::SetAssetIssuance(
    uint32_t tx_in_index, const Amount &asset_amount,
    const std::vector<Amount> &asset_output_amount_list,
    const std::vector<Script> &asset_locking_script_list,
    const std::vector<ConfidentialNonce> &asset_nonce_list,
    const Amount &token_amount,
    const std::vector<Amount> &token_output_amount_list,
    const std::vector<Script> &token_locking_script_list,
    const std::vector<ConfidentialNonce> &token_nonce_list, bool is_blind,
    const ByteData256 &contract_hash) {
  CheckTxInIndex(tx_in_index, __LINE__, __FUNCTION__);

  if ((vin_[tx_in_index].GetInflationKeys().GetData().GetDataSize() > 0) ||
      (vin_[tx_in_index].GetIssuanceAmount().GetData().GetDataSize() > 0)) {
    warn(CFD_LOG_SOURCE, "already set to issue parameter");
    throw CfdException(
        kCfdIllegalArgumentError, "already set to issue parameter");
  }
  if ((asset_amount.GetSatoshiValue() <= 0) &&
      (token_amount.GetSatoshiValue() <= 0)) {
    warn(CFD_LOG_SOURCE, "Issuance must have one non-zero amount.");
    throw CfdException(
        kCfdIllegalArgumentError, "Issuance must have one non-zero amount.");
  }
  if (asset_output_amount_list.empty() != asset_locking_script_list.empty()) {
    warn(
        CFD_LOG_SOURCE,
        "Unmatch count. asset amount list and locking script list.");
    throw CfdException(
        kCfdIllegalArgumentError,
        "Unmatch count. asset amount list and locking script list.");
  }
  if (!asset_output_amount_list.empty()) {
    Amount total;
    for (const auto &amount : asset_output_amount_list) {
      total += amount;
    }
    if (total != asset_amount) {
      warn(CFD_LOG_SOURCE, "Unmatch asset amount.");
      throw CfdException(kCfdIllegalArgumentError, "Unmatch asset amount.");
    }
    for (const auto &script : asset_locking_script_list) {
      if (script.IsEmpty()) {
        warn(CFD_LOG_SOURCE, "Empty locking script from asset.");
        throw CfdException(
            kCfdIllegalArgumentError, "Empty locking script from asset.");
      }
    }
  }
  if (token_output_amount_list.empty() != token_locking_script_list.empty()) {
    warn(
        CFD_LOG_SOURCE,
        "Unmatch count. token amount list and locking script list.");
    throw CfdException(
        kCfdIllegalArgumentError,
        "Unmatch count. token amount list and locking script list.");
  }
  if (!token_output_amount_list.empty()) {
    Amount total;
    for (const auto &amount : token_output_amount_list) {
      total += amount;
    }
    if (total != token_amount) {
      warn(CFD_LOG_SOURCE, "Unmatch token amount.");
      throw CfdException(kCfdIllegalArgumentError, "Unmatch token amount.");
    }
    for (const auto &script : token_locking_script_list) {
      if (script.IsEmpty()) {
        warn(CFD_LOG_SOURCE, "Empty locking script from token.");
        throw CfdException(
            kCfdIllegalArgumentError, "Empty locking script from token.");
      }
    }
  }

  IssuanceParameter param = CalculateIssuanceValue(
      vin_[tx_in_index].GetTxid(), vin_[tx_in_index].GetVout(), is_blind,
      contract_hash, ByteData256());
  SetIssuance(
      tx_in_index, ByteData256(), contract_hash,
      ConfidentialValue(asset_amount), ConfidentialValue(token_amount),
      ByteData(), ByteData());

  if ((!asset_output_amount_list.empty()) &&
      (asset_amount.GetSatoshiValue() > 0)) {
    for (size_t index = 0; index < asset_output_amount_list.size(); ++index) {
      ConfidentialNonce nonce;
      if (index < asset_nonce_list.size()) nonce = asset_nonce_list[index];
      AddTxOut(
          asset_output_amount_list[index], param.asset,
          asset_locking_script_list[index], nonce);
    }
  }
  if ((!token_output_amount_list.empty()) &&
      (token_amount.GetSatoshiValue() > 0)) {
    for (size_t index = 0; index < token_output_amount_list.size(); ++index) {
      ConfidentialNonce nonce;
      if (index < token_nonce_list.size()) nonce = token_nonce_list[index];
      AddTxOut(
          token_output_amount_list[index], param.token,
          token_locking_script_list[index], nonce);
    }
  }

  return param;
}